

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamWriter::writeDTD(QXmlStreamWriter *this,QAnyStringView dtd)

{
  _Head_base<0UL,_QXmlStreamWriterPrivate_*,_false> this_00;
  void *pvVar1;
  size_t in_RCX;
  
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamWriterPrivate,_std::default_delete<QXmlStreamWriterPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamWriterPrivate_*,_std::default_delete<QXmlStreamWriterPrivate>_>
       .super__Head_base<0UL,_QXmlStreamWriterPrivate_*,_false>._M_head_impl;
  QXmlStreamWriterPrivate::finishStartElement(this_00._M_head_impl,true);
  if (((this_00._M_head_impl)->field_0x78 & 0x80) != 0) {
    pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x46f2d8);
    QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x46f2d8,pvVar1,in_RCX);
  }
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,dtd.field_0._0_4_,(void *)dtd.m_size,in_RCX);
  if (((this_00._M_head_impl)->field_0x78 & 0x80) == 0) {
    return;
  }
  pvVar1 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x46f2d8);
  QXmlStreamWriterPrivate::write(this_00._M_head_impl,0x46f2d8,pvVar1,in_RCX);
  return;
}

Assistant:

void QXmlStreamWriter::writeDTD(QAnyStringView dtd)
{
    Q_D(QXmlStreamWriter);
    d->finishStartElement();
    if (d->autoFormatting)
        d->write("\n");
    d->write(dtd);
    if (d->autoFormatting)
        d->write("\n");
}